

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O2

string * __thiscall
soul::repeatedCharacter_abi_cxx11_(string *__return_storage_ptr__,soul *this,char c,size_t num)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,c);
  return __return_storage_ptr__;
}

Assistant:

std::string repeatedCharacter (char c, size_t num)
{
    std::string s;
    s.resize (num, c);
    return s;
}